

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O0

char * add_option_to_json(char *root_options,char *new_option_name,char *new_value_string,
                         int new_value_int)

{
  json_t *json;
  json_t *pjVar1;
  char *ret;
  json_t *temp;
  json_t *root;
  int new_value_int_local;
  char *new_value_string_local;
  char *new_option_name_local;
  char *root_options_local;
  
  json = get_root_option_json_object(root_options);
  if (json == (json_t *)0x0) {
    root_options_local = (char *)0x0;
  }
  else {
    if (new_value_string == (char *)0x0) {
      pjVar1 = json_integer((long)new_value_int);
      if (pjVar1 == (json_t *)0x0) {
        return (char *)0x0;
      }
      json_object_set_new(json,new_option_name,pjVar1);
    }
    else {
      pjVar1 = json_string(new_value_string);
      if (pjVar1 == (json_t *)0x0) {
        return (char *)0x0;
      }
      json_object_set_new(json,new_option_name,pjVar1);
    }
    root_options_local = json_dumps(json,0);
    json_decref(json);
  }
  return root_options_local;
}

Assistant:

static char * add_option_to_json(const char * root_options, const char * new_option_name, const char * new_value_string, int new_value_int)
{
	json_t * root, *temp;
	char * ret;

	root = get_root_option_json_object(root_options);
	if (!root)
		return NULL;

	//Add the new item
	if (new_value_string) {
		ADD_STRING(temp, new_value_string, root, new_option_name);
	} else {
		ADD_INT(temp, new_value_int, root, new_option_name);
	}

	ret = json_dumps(root, 0);
	json_decref(root);
	return ret;
}